

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O1

void boost::to_string_helper<unsigned_long,std::allocator<unsigned_long>,std::__cxx11::string>
               (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,bool dump_all)

{
  ctype cVar1;
  ctype *pcVar2;
  ulong uVar3;
  size_type sVar4;
  locale alStack_38 [8];
  
  std::locale::locale(alStack_38);
  pcVar2 = std::use_facet<std::ctype<char>>(alStack_38);
  std::locale::~locale(alStack_38);
  if (pcVar2[0x38] == (ctype)0x0) {
    std::ctype<char>::_M_widen_init();
    (**(code **)(*(long *)pcVar2 + 0x30))(pcVar2);
  }
  if (pcVar2[0x38] == (ctype)0x0) {
    std::ctype<char>::_M_widen_init();
    cVar1 = (ctype)(**(code **)(*(long *)pcVar2 + 0x30))(pcVar2);
  }
  else {
    cVar1 = pcVar2[0x6a];
  }
  if (dump_all) {
    sVar4 = ((long)(b->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(b->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start) * 8;
  }
  else {
    sVar4 = b->m_num_bits;
  }
  std::__cxx11::string::_M_replace_aux((ulong)s,0,s->_M_string_length,(char)sVar4);
  if (sVar4 != 0) {
    uVar3 = 0;
    do {
      if (((b->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
        *(ctype *)((s->_M_dataplus)._M_p + (sVar4 - 1)) = cVar1;
      }
      uVar3 = uVar3 + 1;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  return;
}

Assistant:

void to_string_helper(const dynamic_bitset<B, A> & b, stringT & s,
                      bool dump_all)
{
    typedef typename stringT::traits_type Tr;
    typedef typename stringT::value_type  Ch;

    BOOST_DYNAMIC_BITSET_CTYPE_FACET(Ch, fac, std::locale());
    const Ch zero = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '0');
    const Ch one  = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '1');

    // Note that this function may access (when
    // dump_all == true) bits beyond position size() - 1

    typedef typename dynamic_bitset<B, A>::size_type size_type;

    const size_type len = dump_all?
         dynamic_bitset<B, A>::bits_per_block * b.num_blocks():
         b.size();
    s.assign (len, zero);

    for (size_type i = 0; i < len; ++i) {
        if (b.m_unchecked_test(i))
            Tr::assign(s[len - 1 - i], one);

    }

}